

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitArrayNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          ArrayNew *curr)

{
  Type *pTVar1;
  uint uVar2;
  Literal *pLVar3;
  HeapType type;
  ulong initialSize;
  long lVar4;
  HeapType heapType;
  undefined1 auStack_168 [8];
  Field field;
  Flow size;
  Literals data;
  Flow init;
  Literal local_78;
  shared_ptr<wasm::GCData> local_60;
  Type *local_50;
  undefined1 auStack_48 [8];
  Literal value;
  
  init.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  init.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  init.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  init.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  init.breakTo.super_IString.str._M_len = 0;
  init.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  init.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str
  ._M_str = (char *)0x0;
  data.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  init.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  if (curr->init != (Expression *)0x0) {
    visit((Flow *)&field.packedType,this,curr->init);
    Flow::operator=((Flow *)&data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (Flow *)&field.packedType);
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&field.packedType);
    if (init.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,
                 (Flow *)&data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      goto LAB_0091fb7d;
    }
  }
  visit((Flow *)&field.packedType,this,curr->size);
  if (size.breakTo.super_IString.str._M_len == 0) {
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression.type.id == 1) {
      visit(__return_storage_ptr__,this,curr->init);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
        __assert_fail("init.breaking()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                      ,0x64e,
                      "Flow wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitArrayNew(ArrayNew *) [SubType = wasm::PrecomputingExpressionRunner]"
                     );
      }
    }
    else {
      pTVar1 = &(curr->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression.type;
      wasm::Type::getHeapType(pTVar1);
      HeapType::getArray(&heapType);
      pLVar3 = Flow::getSingleValue((Flow *)&field.packedType);
      uVar2 = Literal::geti32(pLVar3);
      if (0x2aaaaa9 < uVar2) {
        (*this->_vptr_ExpressionRunner[3])(this,"allocation failure");
      }
      initialSize = (ulong)uVar2;
      SmallVector<wasm::Literal,_1UL>::SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&size.breakTo.super_IString.str._M_str,
                 initialSize);
      local_50 = pTVar1;
      if (curr->init == (Expression *)0x0) {
        for (lVar4 = 0; initialSize * 0x18 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
          Literal::makeZero((Literal *)auStack_48,(Type)heapType.id);
          pLVar3 = (Literal *)
                   ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                   lVar4);
          if (lVar4 == 0) {
            pLVar3 = (Literal *)&data;
          }
          Literal::operator=(pLVar3,(Literal *)auStack_48);
          Literal::~Literal((Literal *)auStack_48);
        }
      }
      else {
        wasm::Type::getHeapType(pTVar1);
        HeapType::getArray((HeapType *)auStack_48);
        auStack_168 = auStack_48;
        field.type.id = value.field_0.i64;
        pLVar3 = Flow::getSingleValue
                           ((Flow *)&data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        Literal::Literal((Literal *)&init.breakTo.super_IString.str._M_str,pLVar3);
        truncateForPacking((Literal *)auStack_48,this,
                           (Literal *)&init.breakTo.super_IString.str._M_str,(Field *)auStack_168);
        Literal::~Literal((Literal *)&init.breakTo.super_IString.str._M_str);
        for (lVar4 = 0; initialSize * 0x18 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
          pLVar3 = (Literal *)
                   ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                   lVar4);
          if (lVar4 == 0) {
            pLVar3 = (Literal *)&data;
          }
          Literal::operator=(pLVar3,(Literal *)auStack_48);
        }
        Literal::~Literal((Literal *)auStack_48);
      }
      pTVar1 = local_50;
      auStack_48 = (undefined1  [8])wasm::Type::getHeapType(local_50);
      std::make_shared<wasm::GCData,wasm::HeapType,wasm::Literals&>
                ((HeapType *)&local_60,(Literals *)auStack_48);
      type = wasm::Type::getHeapType(pTVar1);
      Literal::Literal(&local_78,&local_60,type);
      Flow::Flow(__return_storage_ptr__,&local_78);
      Literal::~Literal(&local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_60.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&size.breakTo.super_IString.str._M_str);
    }
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)&field.packedType);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&field.packedType);
LAB_0091fb7d:
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)
             &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNew(ArrayNew* curr) {
    NOTE_ENTER("ArrayNew");
    Flow init;
    if (!curr->isWithDefault()) {
      init = self()->visit(curr->init);
      if (init.breaking()) {
        return init;
      }
    }
    auto size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // visit the unreachable child, and stop there.
      auto init = self()->visit(curr->init);
      assert(init.breaking());
      return init;
    }
    auto heapType = curr->type.getHeapType();
    const auto& element = heapType.getArray().element;
    Index num = size.getSingleValue().geti32();
    if (num >= ArrayLimit) {
      hostLimit("allocation failure");
    }
    Literals data(num);
    if (curr->isWithDefault()) {
      for (Index i = 0; i < num; i++) {
        data[i] = Literal::makeZero(element.type);
      }
    } else {
      auto field = curr->type.getHeapType().getArray().element;
      auto value = truncateForPacking(init.getSingleValue(), field);
      for (Index i = 0; i < num; i++) {
        data[i] = value;
      }
    }
    return Literal(std::make_shared<GCData>(curr->type.getHeapType(), data),
                   curr->type.getHeapType());
  }